

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_METAL_uniform_type(Context *ctx,RegisterType rtype)

{
  RegisterType rtype_local;
  Context *ctx_local;
  
  if (rtype == REG_TYPE_CONST) {
    ctx_local = (Context *)anon_var_dwarf_466e;
  }
  else if (rtype == REG_TYPE_CONSTINT) {
    ctx_local = (Context *)0x167796;
  }
  else if (rtype == REG_TYPE_CONSTBOOL) {
    ctx_local = (Context *)anon_var_dwarf_8bd;
  }
  else {
    fail(ctx,"BUG: used a uniform we don\'t know how to define.");
    ctx_local = (Context *)0x0;
  }
  return (char *)ctx_local;
}

Assistant:

static const char *get_METAL_uniform_type(Context *ctx, const RegisterType rtype)
{
    switch (rtype)
    {
        case REG_TYPE_CONST: return "float4";
        case REG_TYPE_CONSTINT: return "int4";
        case REG_TYPE_CONSTBOOL: return "bool";
        default: fail(ctx, "BUG: used a uniform we don't know how to define.");
    } // switch

    return NULL;
}